

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char local_2a;
  char local_29;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_28;
  default_random_engine GENERATOR;
  int RANDOM_SEED;
  char **argv_local;
  int argc_local;
  
  GENERATOR._M_x._4_4_ = 0x2a;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_28,0x2a);
  if (argc != 1) {
    if (argc == 3) {
      DemoScripts::TrainSpikingIris(&local_29,(linear_congruential_engine *)argv[1]);
    }
    else {
      DemoScripts::TrainSpikingDigits
                (&local_2a,argv[1],(linear_congruential_engine *)argv[2],(char *)&local_28);
    }
  }
  return 0;
}

Assistant:

int main( int argc, char **argv )
{
    const int RANDOM_SEED = 42;
    std::default_random_engine GENERATOR( RANDOM_SEED );

    if ( argc == 1 ) {
    } else if ( argc == 3 ) {
        DemoScripts().TrainSpikingIris( argv[1], GENERATOR );
    } else {
        DemoScripts().TrainSpikingDigits( argv[1], argv[2], GENERATOR, argv[3] );
    }
}